

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O0

bool am_is_group_and_not_pretending(Am_Object *in_obj)

{
  bool bVar1;
  Am_Value *in_value;
  undefined1 local_28 [8];
  Am_Value v;
  Am_Object *in_obj_local;
  
  v.value = (anon_union_8_8_ea4c8939_for_value)in_obj;
  bVar1 = Am_Is_Group_Or_Map(in_obj);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_28);
    in_value = Am_Object::Peek(in_obj,0x84,0);
    Am_Value::operator=((Am_Value *)local_28,in_value);
    bVar1 = Am_Value::Valid((Am_Value *)local_28);
    if (!bVar1) {
      in_obj_local._7_1_ = 1;
    }
    Am_Value::~Am_Value((Am_Value *)local_28);
    if (!bVar1) goto LAB_00273b7a;
  }
  in_obj_local._7_1_ = 0;
LAB_00273b7a:
  return (bool)(in_obj_local._7_1_ & 1);
}

Assistant:

bool
am_is_group_and_not_pretending(Am_Object in_obj)
{
  if (Am_Is_Group_Or_Map(in_obj)) {
    Am_Value v;
    v = in_obj.Peek(Am_PRETEND_TO_BE_LEAF);
    if (!v.Valid()) {
      return (true);
    }
  }
  return (false);
}